

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O3

void __thiscall
Test_Template_IncludeWithModifiers::Test_Template_IncludeWithModifiers
          (Test_Template_IncludeWithModifiers *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, IncludeWithModifiers) {
  string incname = StringToTemplateFile("include & print file\n");
  string incname2 = StringToTemplateFile("inc2\n");
  string incname3 = StringToTemplateFile("yo&yo");
  // Note this also tests that html-escape, but not javascript-escape or
  // pre-escape, escapes \n to <space>
  Template* tpl1 = StringToTemplate("hi {{>INC:h}} bar\n", DO_NOT_STRIP);
  Template* tpl2 = StringToTemplate("hi {{>INC:javascript_escape}} bar\n",
                                    DO_NOT_STRIP);
  Template* tpl3 = StringToTemplate("hi {{>INC:pre_escape}} bar\n",
                                    DO_NOT_STRIP);
  Template* tpl4 = StringToTemplate("hi {{>INC:u}} bar\n", DO_NOT_STRIP);
  // Test that if we include the same template twice, once with a modifer
  // and once without, they each get applied properly.
  Template* tpl5 = StringToTemplate("hi {{>INC:h}} bar {{>INC}} baz\n",
                                    DO_NOT_STRIP);

  TemplateDictionary dict("dict");
  AssertExpandIs(tpl1, &dict, "hi  bar\n", true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl1, &dict, "hi include &amp; print file  bar\n", true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname2);
  AssertExpandIs(tpl1, &dict, "hi include &amp; print file inc2  bar\n",
                 true);
  AssertExpandIs(tpl2, &dict, "hi include \\x26 print file\\ninc2\\n bar\n",
                 true);
  AssertExpandIs(tpl3, &dict, "hi include &amp; print file\ninc2\n bar\n",
                 true);
  dict.AddIncludeDictionary("INC")->SetFilename(incname3);
  AssertExpandIs(tpl4, &dict,
                 "hi include+%26+print+file%0Ainc2%0Ayo%26yo bar\n",
                 true);
  AssertExpandIs(tpl5, &dict,
                 "hi include &amp; print file inc2 yo&amp;yo bar "
                 "include & print file\ninc2\nyo&yo baz\n",
                 true);

  // Don't test modifier syntax here; that's in TestVariableWithModifiers()
}